

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_sint.hpp
# Opt level: O3

void ans_sint_decompress(uint32_t *dst,size_t to_decode,uint8_t *cSrc,size_t cSrcSize)

{
  undefined1 auVar1 [32];
  undefined1 (*pauVar2) [32];
  undefined1 (*pauVar3) [32];
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  ans_sint_decode ans_frame;
  ans_sint_decode local_88;
  
  ans_sint_decode::load(&local_88,cSrc);
  pauVar3 = (undefined1 (*) [32])(cSrc + (cSrcSize - 0x20));
  uVar4 = to_decode & 0xfffffffffffffffc;
  auVar1 = vpermq_avx2(*pauVar3,0x1b);
  auVar12 = vpbroadcastq_avx512vl();
  auVar1 = vpaddq_avx2(auVar12,auVar1);
  uVar6 = auVar1._0_8_;
  auVar13 = auVar1._16_16_;
  uVar11 = auVar1._16_8_;
  if (local_88.table_type == SINT_SMALL) {
    if (uVar4 != 0) {
      uVar10 = vpextrq_avx(auVar1._0_16_,1);
      uVar7 = 0;
      uVar9 = vpextrq_avx(auVar13,1);
      do {
        uVar5 = local_88.frame_mask & uVar6;
        uVar6 = (ulong)*(ushort *)
                        (local_88.table.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + uVar5 * 8 + 2) +
                (uVar6 >> (local_88.frame_log2 & 0x3f)) *
                (ulong)*(ushort *)
                        (local_88.table.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + uVar5 * 8);
        if (uVar6 < local_88.lower_bound) {
          pauVar2 = pauVar3 + -1;
          pauVar3 = (undefined1 (*) [32])(pauVar3[-1] + 0x1c);
          uVar6 = uVar6 << 0x20 | (ulong)*(uint *)(*pauVar2 + 0x1c);
        }
        uVar8 = uVar10 & local_88.frame_mask;
        dst[uVar7] = *(uint32_t *)
                      (local_88.table.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar5 * 8 + 4);
        uVar10 = (ulong)*(ushort *)
                         (local_88.table.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar8 * 8 + 2) +
                 (ulong)*(ushort *)
                         (local_88.table.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar8 * 8) *
                 (uVar10 >> (local_88.frame_log2 & 0x3f));
        if (uVar10 < local_88.lower_bound) {
          pauVar2 = pauVar3 + -1;
          pauVar3 = (undefined1 (*) [32])(pauVar3[-1] + 0x1c);
          uVar10 = uVar10 << 0x20 | (ulong)*(uint *)(*pauVar2 + 0x1c);
        }
        uVar5 = uVar11 & local_88.frame_mask;
        dst[uVar7 + 1] =
             *(uint32_t *)
              (local_88.table.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar8 * 8 + 4);
        uVar11 = (ulong)*(ushort *)
                         (local_88.table.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar5 * 8 + 2) +
                 (ulong)*(ushort *)
                         (local_88.table.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar5 * 8) *
                 (uVar11 >> (local_88.frame_log2 & 0x3f));
        if (uVar11 < local_88.lower_bound) {
          pauVar2 = pauVar3 + -1;
          pauVar3 = (undefined1 (*) [32])(pauVar3[-1] + 0x1c);
          uVar11 = uVar11 << 0x20 | (ulong)*(uint *)(*pauVar2 + 0x1c);
        }
        uVar8 = uVar9 & local_88.frame_mask;
        dst[uVar7 + 2] =
             *(uint32_t *)
              (local_88.table.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar5 * 8 + 4);
        uVar9 = (ulong)*(ushort *)
                        (local_88.table.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + uVar8 * 8 + 2) +
                (uVar9 >> (local_88.frame_log2 & 0x3f)) *
                (ulong)*(ushort *)
                        (local_88.table.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + uVar8 * 8);
        if (uVar9 < local_88.lower_bound) {
          pauVar2 = pauVar3 + -1;
          pauVar3 = (undefined1 (*) [32])(pauVar3[-1] + 0x1c);
          uVar9 = uVar9 << 0x20 | (ulong)*(uint *)(*pauVar2 + 0x1c);
        }
        dst[uVar7 + 3] =
             *(uint32_t *)
              (local_88.table.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar8 * 8 + 4);
        uVar7 = uVar7 + 4;
      } while (uVar4 != uVar7);
      auVar12 = vpbroadcastq_avx512vl();
      auVar1 = vpblendd_avx2(auVar1,auVar12,0xc0);
      auVar13 = auVar1._16_16_;
    }
    if (uVar4 != to_decode) {
      uVar6 = vpextrq_avx(auVar13,1);
      do {
        uVar11 = local_88.frame_mask & uVar6;
        uVar6 = (ulong)*(ushort *)
                        (local_88.table.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + uVar11 * 8 + 2) +
                (uVar6 >> (local_88.frame_log2 & 0x3f)) *
                (ulong)*(ushort *)
                        (local_88.table.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + uVar11 * 8);
        if (uVar6 < local_88.lower_bound) {
          pauVar2 = pauVar3 + -1;
          pauVar3 = (undefined1 (*) [32])(pauVar3[-1] + 0x1c);
          uVar6 = uVar6 << 0x20 | (ulong)*(uint *)(*pauVar2 + 0x1c);
        }
        dst[uVar4] = *(uint32_t *)
                      (local_88.table.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar11 * 8 + 4);
        uVar4 = uVar4 + 1;
      } while (to_decode != uVar4);
    }
  }
  else {
    if (uVar4 != 0) {
      uVar7 = vpextrq_avx(auVar1._0_16_,1);
      uVar9 = 0;
      uVar10 = vpextrq_avx(auVar13,1);
      do {
        uVar5 = local_88.frame_mask & uVar6;
        uVar6 = (ulong)*(uint *)(local_88.table.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + uVar5 * 0xc + 4) +
                (uVar6 >> (local_88.frame_log2 & 0x3f)) *
                (ulong)*(uint *)(local_88.table.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + uVar5 * 0xc);
        if (uVar6 < local_88.lower_bound) {
          pauVar2 = pauVar3 + -1;
          pauVar3 = (undefined1 (*) [32])(pauVar3[-1] + 0x1c);
          uVar6 = uVar6 << 0x20 | (ulong)*(uint *)(*pauVar2 + 0x1c);
        }
        uVar8 = uVar7 & local_88.frame_mask;
        dst[uVar9] = *(uint32_t *)
                      (local_88.table.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar5 * 0xc + 8);
        uVar7 = (ulong)*(uint *)(local_88.table.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + uVar8 * 0xc + 4) +
                (ulong)*(uint *)(local_88.table.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + uVar8 * 0xc) *
                (uVar7 >> (local_88.frame_log2 & 0x3f));
        if (uVar7 < local_88.lower_bound) {
          pauVar2 = pauVar3 + -1;
          pauVar3 = (undefined1 (*) [32])(pauVar3[-1] + 0x1c);
          uVar7 = uVar7 << 0x20 | (ulong)*(uint *)(*pauVar2 + 0x1c);
        }
        uVar5 = uVar11 & local_88.frame_mask;
        dst[uVar9 + 1] =
             *(uint32_t *)
              (local_88.table.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar8 * 0xc + 8);
        uVar11 = (ulong)*(uint *)(local_88.table.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + uVar5 * 0xc + 4) +
                 (ulong)*(uint *)(local_88.table.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + uVar5 * 0xc) *
                 (uVar11 >> (local_88.frame_log2 & 0x3f));
        if (uVar11 < local_88.lower_bound) {
          pauVar2 = pauVar3 + -1;
          pauVar3 = (undefined1 (*) [32])(pauVar3[-1] + 0x1c);
          uVar11 = uVar11 << 0x20 | (ulong)*(uint *)(*pauVar2 + 0x1c);
        }
        dst[uVar9 + 2] =
             *(uint32_t *)
              (local_88.table.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar5 * 0xc + 8);
        uVar5 = uVar10 & local_88.frame_mask;
        uVar10 = (ulong)*(uint *)(local_88.table.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + uVar5 * 0xc + 4) +
                 (uVar10 >> (local_88.frame_log2 & 0x3f)) *
                 (ulong)*(uint *)(local_88.table.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + uVar5 * 0xc);
        if (uVar10 < local_88.lower_bound) {
          pauVar2 = pauVar3 + -1;
          pauVar3 = (undefined1 (*) [32])(pauVar3[-1] + 0x1c);
          uVar10 = uVar10 << 0x20 | (ulong)*(uint *)(*pauVar2 + 0x1c);
        }
        dst[uVar9 + 3] =
             *(uint32_t *)
              (local_88.table.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar5 * 0xc + 8);
        uVar9 = uVar9 + 4;
      } while (uVar4 != uVar9);
      auVar12 = vpbroadcastq_avx512vl();
      auVar1 = vpblendd_avx2(auVar1,auVar12,0xc0);
      auVar13 = auVar1._16_16_;
    }
    if (uVar4 != to_decode) {
      uVar6 = vpextrq_avx(auVar13,1);
      do {
        uVar11 = local_88.frame_mask & uVar6;
        uVar6 = (ulong)*(uint *)(local_88.table.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + uVar11 * 0xc + 4) +
                (uVar6 >> (local_88.frame_log2 & 0x3f)) *
                (ulong)*(uint *)(local_88.table.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + uVar11 * 0xc);
        if (uVar6 < local_88.lower_bound) {
          pauVar2 = pauVar3 + -1;
          pauVar3 = (undefined1 (*) [32])(pauVar3[-1] + 0x1c);
          uVar6 = uVar6 << 0x20 | (ulong)*(uint *)(*pauVar2 + 0x1c);
        }
        dst[uVar4] = *(uint32_t *)
                      (local_88.table.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar11 * 0xc + 8);
        uVar4 = uVar4 + 1;
      } while (to_decode != uVar4);
    }
  }
  if (local_88.table.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.table.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.table.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.table.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_88.nfreqs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.nfreqs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.nfreqs.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.nfreqs.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ans_sint_decompress(
    uint32_t* dst, size_t to_decode, const uint8_t* cSrc, size_t cSrcSize)
{
    const uint32_t num_states = 4;
    auto in_u8 = reinterpret_cast<const uint8_t*>(cSrc);
    auto ans_frame = ans_sint_decode::load(in_u8);
    in_u8 += cSrcSize;

    std::array<uint64_t, num_states> states;

    for (uint32_t i = 0; i < num_states; i++) {
        states[i] = ans_frame.init_state(in_u8);
    }
    size_t cur_idx = 0;
    auto out_u32 = reinterpret_cast<uint32_t*>(dst);
    size_t fast_decode = to_decode - (to_decode % num_states);
    if (ans_frame.table_type == dec_table_type_sint::SINT_SMALL) {
        while (cur_idx != fast_decode) {
            out_u32[cur_idx]
                = ans_frame.decode_sym<dec_entry_sint_small>(states[0], in_u8);
            out_u32[cur_idx + 1]
                = ans_frame.decode_sym<dec_entry_sint_small>(states[1], in_u8);
            out_u32[cur_idx + 2]
                = ans_frame.decode_sym<dec_entry_sint_small>(states[2], in_u8);
            out_u32[cur_idx + 3]
                = ans_frame.decode_sym<dec_entry_sint_small>(states[3], in_u8);
            cur_idx += num_states;
        }
        while (cur_idx != to_decode) {
            out_u32[cur_idx++] = ans_frame.decode_sym<dec_entry_sint_small>(
                states[num_states - 1], in_u8);
        }
    } else {
        while (cur_idx != fast_decode) {
            out_u32[cur_idx]
                = ans_frame.decode_sym<dec_entry_sint>(states[0], in_u8);
            out_u32[cur_idx + 1]
                = ans_frame.decode_sym<dec_entry_sint>(states[1], in_u8);
            out_u32[cur_idx + 2]
                = ans_frame.decode_sym<dec_entry_sint>(states[2], in_u8);
            out_u32[cur_idx + 3]
                = ans_frame.decode_sym<dec_entry_sint>(states[3], in_u8);
            cur_idx += num_states;
        }
        while (cur_idx != to_decode) {
            out_u32[cur_idx++] = ans_frame.decode_sym<dec_entry_sint>(
                states[num_states - 1], in_u8);
        }
    }
}